

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

void __thiscall
GEO::PeriodicDelaunay3d::get_incident_tets(PeriodicDelaunay3d *this,index_t v,IncidentTetrahedra *W)

{
  bool bVar1;
  index_t iVar2;
  index_t *piVar3;
  uint *puVar4;
  reference pvVar5;
  index_t local_40;
  index_t local_3c;
  index_t neigh;
  index_t lv;
  signed_index_t *T;
  index_t slot;
  index_t v_instance;
  index_t v_real;
  index_t t;
  IncidentTetrahedra *W_local;
  PeriodicDelaunay3d *pPStack_10;
  index_t v_local;
  PeriodicDelaunay3d *this_local;
  
  _v_real = W;
  W_local._4_4_ = v;
  pPStack_10 = this;
  IncidentTetrahedra::clear_incident_tets(W);
  v_instance = 0xffffffff;
  if (W_local._4_4_ < *(uint *)&(this->super_Delaunay).field_0xf4) {
    piVar3 = (index_t *)vector<int>::operator[](&(this->super_Delaunay).v_to_cell_,W_local._4_4_);
    v_instance = *piVar3;
  }
  else {
    slot = Periodic::periodic_vertex_real
                     ((Periodic *)&(this->super_Delaunay).field_0xf4,W_local._4_4_);
    T._4_4_ = Periodic::periodic_vertex_instance
                        ((Periodic *)&(this->super_Delaunay).field_0xf4,W_local._4_4_);
    puVar4 = vector<unsigned_int>::operator[](&this->vertex_instances_,slot);
    iVar2 = anon_unknown.dwarf_5292d::pop_count(*puVar4 & (1 << ((byte)T._4_4_ & 0x1f)) - 1U);
    T._0_4_ = iVar2 - 1;
    puVar4 = vector<unsigned_int>::operator[](&this->periodic_v_to_cell_rowptr_,slot);
    puVar4 = vector<unsigned_int>::operator[](&this->periodic_v_to_cell_data_,*puVar4 + (int)T);
    v_instance = *puVar4;
  }
  if (v_instance != 0xffffffff) {
    IncidentTetrahedra::add_incident_tet(_v_real,v_instance);
    std::stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::push
              (&_v_real->S,&v_instance);
    while (bVar1 = std::
                   stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::
                   empty(&_v_real->S), ((bVar1 ^ 0xffU) & 1) != 0) {
      pvVar5 = std::stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::
               top(&_v_real->S);
      v_instance = *pvVar5;
      std::stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::pop
                (&_v_real->S);
      _neigh = vector<int>::operator[](&this->cell_to_v_store_,v_instance << 2);
      local_3c = PeriodicDelaunay3dThread::find_4(_neigh,W_local._4_4_);
      piVar3 = (index_t *)
               vector<int>::operator[]
                         (&this->cell_to_cell_store_,v_instance * 4 + (local_3c + 1 & 3));
      local_40 = *piVar3;
      if ((local_40 != 0xffffffff) &&
         (bVar1 = IncidentTetrahedra::has_incident_tet(_v_real,local_40), !bVar1)) {
        IncidentTetrahedra::add_incident_tet(_v_real,local_40);
        std::stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::push
                  (&_v_real->S,&local_40);
      }
      piVar3 = (index_t *)
               vector<int>::operator[]
                         (&this->cell_to_cell_store_,v_instance * 4 + (local_3c + 2 & 3));
      local_40 = *piVar3;
      if ((local_40 != 0xffffffff) &&
         (bVar1 = IncidentTetrahedra::has_incident_tet(_v_real,local_40), !bVar1)) {
        IncidentTetrahedra::add_incident_tet(_v_real,local_40);
        std::stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::push
                  (&_v_real->S,&local_40);
      }
      piVar3 = (index_t *)
               vector<int>::operator[]
                         (&this->cell_to_cell_store_,v_instance * 4 + (local_3c + 3 & 3));
      local_40 = *piVar3;
      if ((local_40 != 0xffffffff) &&
         (bVar1 = IncidentTetrahedra::has_incident_tet(_v_real,local_40), !bVar1)) {
        IncidentTetrahedra::add_incident_tet(_v_real,local_40);
        std::stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::push
                  (&_v_real->S,&local_40);
      }
    }
  }
  return;
}

Assistant:

void PeriodicDelaunay3d::get_incident_tets(
	index_t v, IncidentTetrahedra& W
    ) const {

	geo_debug_assert(
	    periodic_ || v < nb_vertices_non_periodic_
	);

	W.clear_incident_tets();

	index_t t = index_t(-1);
	if(v < nb_vertices_non_periodic_) {
	    t = index_t(v_to_cell_[v]);
	} else {
	    index_t v_real = periodic_vertex_real(v);
	    index_t v_instance = periodic_vertex_instance(v);
	    
	    geo_debug_assert(
		(vertex_instances_[v_real] & (1u << v_instance))!=0
	    );

	    index_t slot = pop_count(
		vertex_instances_[v_real] & ((1u << v_instance)-1)
	    ) - 1;

	    t = periodic_v_to_cell_data_[
		periodic_v_to_cell_rowptr_[v_real] + slot
	    ];
	}
	
	// Can happen: empty power cell.
	if(t == index_t(-1)) {
	    return;
	}

	// TODO: different version if CICL is stored ?
	{
	    W.add_incident_tet(t);
	    W.S.push(t);
	    while(!W.S.empty()) {
		t = W.S.top();
		W.S.pop();
		const signed_index_t* T = &(cell_to_v_store_[4 * t]);
		index_t lv = PeriodicDelaunay3dThread::find_4(
		    T,signed_index_t(v)
		);
		index_t neigh = index_t(cell_to_cell_store_[4*t + (lv + 1)%4]);
		if(neigh != index_t(-1) && !W.has_incident_tet(neigh)) {
		    W.add_incident_tet(neigh);
		    W.S.push(neigh);
		}
		neigh = index_t(cell_to_cell_store_[4*t + (lv + 2)%4]);
		if(neigh != index_t(-1) && !W.has_incident_tet(neigh)) {
		    W.add_incident_tet(neigh);
		    W.S.push(neigh);
		}
		neigh = index_t(cell_to_cell_store_[4*t + (lv + 3)%4]);
		if(neigh != index_t(-1) && !W.has_incident_tet(neigh)) {
		    W.add_incident_tet(neigh);
		    W.S.push(neigh);
		}
	    }
	}
    }